

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

char * decode_decimal(char *str,unsigned_long *v)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  char *orig;
  long lVar4;
  char cVar5;
  
  cVar1 = *str;
  if (0xf5 < (byte)(cVar1 - 0x3aU)) {
    uVar3 = 0;
    lVar4 = 0;
    cVar5 = cVar1;
    do {
      if (0x1999999999999999 < uVar3) {
        return (char *)0x0;
      }
      uVar2 = uVar3 * 10;
      uVar3 = (byte)(cVar5 - 0x30) + uVar2;
      if (CARRY8((ulong)(byte)(cVar5 - 0x30),uVar2)) {
        return (char *)0x0;
      }
      cVar5 = str[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (0xf5 < (byte)(cVar5 - 0x3aU));
    if (lVar4 == 1 || cVar1 != '0') {
      *v = uVar3;
      return str + lVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *decode_decimal(const char *str, unsigned long *v) {
    const char *orig;
    unsigned long acc;

    acc = 0;
    for (orig = str;; str++) {
        int c;

        c = *str;
        if (c < '0' || c > '9') {
            break;
        }
        c -= '0';
        if (acc > (ULONG_MAX / 10)) {
            return NULL;
        }
        acc *= 10;
        if ((unsigned long)c > (ULONG_MAX - acc)) {
            return NULL;
        }
        acc += (unsigned long)c;
    }
    if (str == orig || (*orig == '0' && str != (orig + 1))) {
        return NULL;
    }
    *v = acc;
    return str;
}